

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O0

int main(void)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  Exception *ex;
  undefined4 local_10;
  uint len;
  
  for (local_10 = 0; local_10 < 0x80; local_10 = local_10 + 1) {
    test_i8(local_10,0x2a);
    cVar1 = std::numeric_limits<signed_char>::min();
    test_i8(local_10,(int)cVar1);
    cVar1 = std::numeric_limits<signed_char>::max();
    test_i8(local_10,(int)cVar1);
    test_u8(local_10,0x2a);
    bVar2 = std::numeric_limits<unsigned_char>::min();
    test_u8(local_10,(uint)bVar2);
    bVar2 = std::numeric_limits<unsigned_char>::max();
    test_u8(local_10,(uint)bVar2);
    test_i16(local_10,0x2a);
    sVar3 = std::numeric_limits<short>::min();
    test_i16(local_10,(int)sVar3);
    sVar3 = std::numeric_limits<short>::max();
    test_i16(local_10,(int)sVar3);
    test_u16(local_10,0x2a);
    uVar4 = std::numeric_limits<unsigned_short>::min();
    test_u16(local_10,(uint)uVar4);
    uVar4 = std::numeric_limits<unsigned_short>::max();
    test_u16(local_10,(uint)uVar4);
    test_i32(local_10,0x2a);
    iVar5 = std::numeric_limits<int>::min();
    test_i32(local_10,iVar5);
    iVar5 = std::numeric_limits<int>::max();
    test_i32(local_10,iVar5);
    test_i64(local_10,0x2a);
    lVar6 = std::numeric_limits<long>::min();
    test_i64(local_10,lVar6);
    lVar6 = std::numeric_limits<long>::max();
    test_i64(local_10,lVar6);
    test_float(local_10,42.0);
    fVar7 = std::numeric_limits<float>::min();
    test_float(local_10,fVar7);
    fVar7 = std::numeric_limits<float>::max();
    test_float(local_10,fVar7);
    fVar7 = std::numeric_limits<float>::denorm_min();
    test_float(local_10,fVar7);
    fVar7 = std::numeric_limits<float>::epsilon();
    test_float(local_10,fVar7);
  }
  return 0;
}

Assistant:

int main()
{
    using std::numeric_limits;

    try
    {
        for (unsigned len = 0; len < 128; ++len)
        {
            test_i8(len, 42);
            test_i8(len, numeric_limits<int8_t>::min());
            test_i8(len, numeric_limits<int8_t>::max());

            test_u8(len, 42);
            test_u8(len, numeric_limits<uint8_t>::min());
            test_u8(len, numeric_limits<uint8_t>::max());

            test_i16(len, 42);
            test_i16(len, numeric_limits<int16_t>::min());
            test_i16(len, numeric_limits<int16_t>::max());

            test_u16(len, 42);
            test_u16(len, numeric_limits<uint16_t>::min());
            test_u16(len, numeric_limits<uint16_t>::max());

            test_i32(len, 42);
            test_i32(len, numeric_limits<int32_t>::min());
            test_i32(len, numeric_limits<int32_t>::max());

            test_i64(len, 42);
            test_i64(len, numeric_limits<int64_t>::min());
            test_i64(len, numeric_limits<int64_t>::max());

            test_float(len, 42);
            test_float(len, numeric_limits<float>::min());
            test_float(len, numeric_limits<float>::max());
            test_float(len, numeric_limits<float>::denorm_min());
            test_float(len, numeric_limits<float>::epsilon());
        }
    }
    catch (const Exception& ex)
    {
        std::cerr << "func: " << ex.func_ << " line: " << ex.line_ << " len: " << ex.length_ << std::endl;
        return 1;
    }

    return 0;
}